

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PopFunctionBlockerBarrier(cmMakefile *this,bool reportError)

{
  pointer *ppuVar1;
  ulong uVar2;
  pointer puVar3;
  cmFunctionBlocker *pcVar4;
  ostream *poVar5;
  string sStack_1c8;
  ostringstream e;
  
  uVar2 = (this->FunctionBlockerBarriers).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  while (puVar3 = (this->FunctionBlockers).c.
                  super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        uVar2 < (ulong)((long)puVar3 -
                        (long)(this->FunctionBlockers).c.
                              super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    pcVar4 = puVar3[-1]._M_t.
             super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>._M_t.
             super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
             super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl;
    puVar3[-1]._M_t.
    super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>._M_t.
    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
    super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl = (cmFunctionBlocker *)0x0;
    std::
    vector<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
    ::pop_back(&(this->FunctionBlockers).c);
    if ((reportError & 1U) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar5 = std::operator<<((ostream *)&e,"A logical block opening on the line\n");
      poVar5 = std::operator<<(poVar5,"  ");
      poVar5 = operator<<(poVar5,&pcVar4->StartingContext);
      poVar5 = std::operator<<(poVar5,"\n");
      std::operator<<(poVar5,"is not closed.");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&sStack_1c8);
      std::__cxx11::string::~string((string *)&sStack_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    reportError = false;
    if (pcVar4 != (cmFunctionBlocker *)0x0) {
      (*pcVar4->_vptr_cmFunctionBlocker[1])(pcVar4);
      reportError = false;
    }
  }
  ppuVar1 = &(this->FunctionBlockerBarriers).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  return;
}

Assistant:

void cmMakefile::PopFunctionBlockerBarrier(bool reportError)
{
  // Remove any extra entries pushed on the barrier.
  FunctionBlockersType::size_type barrier =
    this->FunctionBlockerBarriers.back();
  while (this->FunctionBlockers.size() > barrier) {
    std::unique_ptr<cmFunctionBlocker> fb(
      std::move(this->FunctionBlockers.top()));
    this->FunctionBlockers.pop();
    if (reportError) {
      // Report the context in which the unclosed block was opened.
      cmListFileContext const& lfc = fb->GetStartingContext();
      std::ostringstream e;
      /* clang-format off */
      e << "A logical block opening on the line\n"
        << "  " << lfc << "\n"
        << "is not closed.";
      /* clang-format on */
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      reportError = false;
    }
  }

  // Remove the barrier.
  this->FunctionBlockerBarriers.pop_back();
}